

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O2

void __thiscall
crnlib::adaptive_huffman_data_model::adaptive_huffman_data_model
          (adaptive_huffman_data_model *this,adaptive_huffman_data_model *other)

{
  *(undefined8 *)((long)&(this->m_code_sizes).m_size + 2) = 0;
  *(undefined8 *)((long)&this->m_pDecode_tables + 2) = 0;
  (this->m_code_sizes).m_p = (uchar *)0x0;
  (this->m_code_sizes).m_size = 0;
  (this->m_code_sizes).m_capacity = 0;
  (this->m_codes).m_p = (unsigned_short *)0x0;
  (this->m_codes).m_size = 0;
  (this->m_codes).m_capacity = 0;
  (this->m_sym_freq).m_p = (unsigned_short *)0x0;
  (this->m_sym_freq).m_size = 0;
  (this->m_sym_freq).m_capacity = 0;
  this->m_total_syms = 0;
  this->m_update_cycle = 0;
  this->m_symbols_until_update = 0;
  this->m_total_count = 0;
  operator=(this,other);
  return;
}

Assistant:

adaptive_huffman_data_model::adaptive_huffman_data_model(const adaptive_huffman_data_model& other) :
        m_total_syms(0),
        m_update_cycle(0),
        m_symbols_until_update(0),
        m_total_count(0),
        m_pDecode_tables(nullptr),
        m_decoder_table_bits(0),
        m_encoding(false)
    {
        *this = other;
    }